

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

FrameDisplay * __thiscall
Js::InterpreterStackFrame::OP_LdFrameDisplayNoParent<false>
          (InterpreterStackFrame *this,void *argHead,ScriptContext *scriptContext)

{
  ushort uVar1;
  RegSlot RVar2;
  FrameDisplay *pFVar3;
  void *argEnv;
  
  uVar1 = *(ushort *)
           &((*(FunctionBody **)(this + 0x88))->super_ParseableFunctionInfo).super_FunctionProxy.
            field_0x45;
  RVar2 = FunctionBody::GetEnvRegister(*(FunctionBody **)(this + 0x88));
  if (RVar2 == 0xffffffff) {
    argEnv = (void *)0x0;
  }
  else {
    argEnv = *(void **)(*(long *)(this + 0x80) + 0x30);
  }
  if (argEnv != (void *)0x0) {
    if ((uVar1 >> 8 & 1) == 0) {
      pFVar3 = JavascriptOperators::OP_LdFrameDisplay(argHead,argEnv,scriptContext);
      return pFVar3;
    }
    pFVar3 = JavascriptOperators::OP_LdStrictFrameDisplay(argHead,argEnv,scriptContext);
    return pFVar3;
  }
  if ((uVar1 >> 8 & 1) == 0) {
    pFVar3 = JavascriptOperators::OP_LdFrameDisplayNoParent(argHead,scriptContext);
    return pFVar3;
  }
  pFVar3 = JavascriptOperators::OP_LdStrictFrameDisplayNoParent(argHead,scriptContext);
  return pFVar3;
}

Assistant:

FrameDisplay *
        InterpreterStackFrame::OP_LdFrameDisplayNoParent(void *argHead, ScriptContext *scriptContext)
    {
        FrameDisplay *frameDisplay;
        bool strict = this->m_functionBody->GetIsStrictMode();

        Var argEnv = nullptr;
        if (innerFD && this->m_functionBody->GetLocalFrameDisplayRegister() != Constants::NoRegister)
        {
            argEnv = this->GetLocalFrameDisplay();
        }
        if (argEnv == nullptr && this->m_functionBody->GetEnvRegister() != Constants::NoRegister)
        {
            argEnv = this->LdEnv();
        }

        if (argEnv == nullptr)
        {
            if (strict)
            {
                frameDisplay = JavascriptOperators::OP_LdStrictFrameDisplayNoParent(argHead, scriptContext);
            }
            else
            {
                frameDisplay = JavascriptOperators::OP_LdFrameDisplayNoParent(argHead, scriptContext);
            }
        }
        else
        {
            if (strict)
            {
                frameDisplay = JavascriptOperators::OP_LdStrictFrameDisplay(argHead, argEnv, scriptContext);
            }
            else
            {
                frameDisplay = JavascriptOperators::OP_LdFrameDisplay(argHead, argEnv, scriptContext);
            }
        }
        return frameDisplay;
    }